

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction.cpp
# Opt level: O0

string * __thiscall
cfd::api::TransactionApi::CreateSignatureHash
          (TransactionApi *this,string *tx_hex,Txid *txid,uint32_t vout,ByteData *key_data,
          Amount *amount,HashType hash_type,SigHashType *sighash_type)

{
  undefined8 uVar1;
  string *in_RDI;
  ByteData *in_R9;
  ByteData *in_stack_00000008;
  int in_stack_00000010;
  SigHashType *in_stack_00000018;
  WitnessVersion version;
  TransactionController txc;
  ByteData sig_hash;
  ByteData *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  string *in_stack_fffffffffffffe18;
  TransactionController *in_stack_fffffffffffffe20;
  string *message;
  undefined8 in_stack_fffffffffffffe28;
  CfdError error_code;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined1 local_199 [33];
  char *local_178;
  undefined4 local_170;
  char *local_168;
  SigHashType *in_stack_fffffffffffffea8;
  Script *in_stack_fffffffffffffeb0;
  uint32_t in_stack_fffffffffffffebc;
  Txid *in_stack_fffffffffffffec0;
  TransactionController *in_stack_fffffffffffffec8;
  pointer in_stack_fffffffffffffee0;
  WitnessVersion in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  Pubkey *in_stack_fffffffffffffef0;
  uint32_t in_stack_fffffffffffffefc;
  Txid *in_stack_ffffffffffffff00;
  TransactionController *in_stack_ffffffffffffff08;
  Amount *in_stack_ffffffffffffff20;
  WitnessVersion in_stack_ffffffffffffff28;
  undefined4 local_a8;
  ByteData local_48;
  ByteData *local_30;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  local_30 = in_R9;
  core::ByteData::ByteData(&local_48);
  TransactionController::TransactionController(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  local_a8 = 0xffffffff;
  if ((in_stack_00000010 == 2) || (in_stack_00000010 == 3)) {
    local_a8 = 0;
  }
  switch(in_stack_00000010) {
  case 0:
  case 2:
    core::ByteData::ByteData
              ((ByteData *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               in_stack_fffffffffffffe08);
    core::Pubkey::Pubkey((Pubkey *)&stack0xffffffffffffff28,(ByteData *)&stack0xffffffffffffff10);
    core::SigHashType::SigHashType((SigHashType *)&stack0xffffffffffffff04,in_stack_00000018);
    TransactionController::CreateSignatureHash
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
               in_stack_fffffffffffffef0,
               (SigHashType *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
    core::ByteData::operator=
              ((ByteData *)CONCAT44(in_stack_fffffffffffffe14,local_a8),in_stack_00000008);
    core::ByteData::~ByteData((ByteData *)0x53f8c6);
    core::Pubkey::~Pubkey((Pubkey *)0x53f8d3);
    core::ByteData::~ByteData((ByteData *)0x53f8e0);
    break;
  case 1:
  case 3:
    core::Script::Script((Script *)&stack0xfffffffffffffeb0,local_30);
    core::SigHashType::SigHashType((SigHashType *)&stack0xfffffffffffffea4,in_stack_00000018);
    TransactionController::CreateSignatureHash
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
               in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (Amount *)in_stack_fffffffffffffee0,in_stack_fffffffffffffee8);
    core::ByteData::operator=
              ((ByteData *)CONCAT44(in_stack_fffffffffffffe14,local_a8),in_stack_00000008);
    core::ByteData::~ByteData((ByteData *)0x53f9f7);
    core::Script::~Script((Script *)CONCAT44(in_stack_fffffffffffffe14,local_a8));
    break;
  default:
    local_178 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfdapi_transaction.cpp"
                        ,0x2f);
    local_178 = local_178 + 1;
    local_170 = 0xb3;
    local_168 = "CreateSignatureHash";
    core::logger::warn<cfd::core::HashType&>
              ((CfdSourceLocation *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               (char *)in_stack_fffffffffffffe08,(HashType *)0x53fa81);
    uVar1 = __cxa_allocate_exception(0x30);
    message = (string *)local_199;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_199 + 1),
               "Invalid hash_type. hash_type must be \"p2pkh\"(0) or \"p2sh\"(1) or \"p2wpkh\"(2) or \"p2wsh\"(3)."
               ,(allocator *)message);
    core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               error_code,message);
    __cxa_throw(uVar1,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  core::ByteData::GetHex_abi_cxx11_(in_RDI,&local_48);
  TransactionController::~TransactionController
            ((TransactionController *)CONCAT44(in_stack_fffffffffffffe14,local_a8));
  core::ByteData::~ByteData((ByteData *)0x53fb77);
  return in_RDI;
}

Assistant:

std::string TransactionApi::CreateSignatureHash(
    const std::string& tx_hex, const Txid& txid, uint32_t vout,
    const ByteData& key_data, const Amount& amount, HashType hash_type,
    const SigHashType& sighash_type) const {
  ByteData sig_hash;
  TransactionController txc(tx_hex);
  WitnessVersion version = WitnessVersion::kVersionNone;
  if ((hash_type == HashType::kP2wpkh) || (hash_type == HashType::kP2wsh)) {
    version = WitnessVersion::kVersion0;
  }

  switch (hash_type) {
    case HashType::kP2pkh:
      // fall-through
    case HashType::kP2wpkh:
      sig_hash = txc.CreateSignatureHash(
          txid, vout, Pubkey(key_data), sighash_type, amount, version);
      break;
    case HashType::kP2sh:
      // fall-through
    case HashType::kP2wsh:
      sig_hash = txc.CreateSignatureHash(
          txid, vout, Script(key_data), sighash_type, amount, version);
      break;
    default:
      warn(
          CFD_LOG_SOURCE,
          "Failed to CreateSignatureHash. Invalid hash_type: "
          "hash_type={}",  // NOLINT
          hash_type);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid hash_type. hash_type must be \"p2pkh\"(0) "
          "or \"p2sh\"(1) or \"p2wpkh\"(2) or \"p2wsh\"(3).");  // NOLINT
  }

  return sig_hash.GetHex();
}